

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O2

void __thiscall dlib::image_window::image_window(image_window *this)

{
  image_display *this_00;
  
  drawable_window::drawable_window(&this->super_drawable_window,true,false);
  (this->super_drawable_window).super_base_window._vptr_base_window =
       (_func_int **)&PTR__image_window_003369e0;
  this_00 = &this->gui_img;
  image_display::image_display(this_00,&this->super_drawable_window);
  (this->image_rect).l = 0;
  (this->image_rect).t = 0;
  *(undefined4 *)&(this->image_rect).r = 0xffffffff;
  *(undefined4 *)((long)&(this->image_rect).r + 4) = 0xffffffff;
  *(undefined4 *)&(this->image_rect).b = 0xffffffff;
  *(undefined4 *)((long)&(this->image_rect).b + 4) = 0xffffffff;
  (this->previous_image_size).l = 0;
  (this->previous_image_size).t = 0;
  *(undefined4 *)&(this->previous_image_size).r = 0xffffffff;
  *(undefined4 *)((long)&(this->previous_image_size).r + 4) = 0xffffffff;
  *(undefined4 *)&(this->previous_image_size).b = 0xffffffff;
  *(undefined4 *)((long)&(this->previous_image_size).b + 4) = 0xffffffff;
  this->window_has_closed = false;
  this->have_last_click = false;
  (this->last_clicked_point).
  super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>.
  data.data[0] = 0;
  (this->last_clicked_point).
  super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>.
  data.data[1] = 0;
  this->mouse_btn = 0;
  rsignaler::rsignaler(&this->clicked_signaler,(this->super_drawable_window).super_base_window.wm);
  this->tie_input_events = false;
  image_display::set_image_clicked_handler<dlib::image_window>
            (this_00,this,(offset_in_image_window_to_subr)on_image_clicked);
  image_display::disable_overlay_editing(this_00);
  (*(this->super_drawable_window).super_base_window._vptr_base_window[2])(this);
  return;
}

Assistant:

image_window::
    image_window(
    ) :
        gui_img(*this),
        window_has_closed(false),
        have_last_click(false),
        mouse_btn(0),
        clicked_signaler(this->wm),
        tie_input_events(false)
    {

        gui_img.set_image_clicked_handler(*this, &image_window::on_image_clicked);
        gui_img.disable_overlay_editing();
        // show this window on the screen
        show();
    }